

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int itf8_decode(cram_fd *fd,int32_t *val_p)

{
  hFILE *phVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  phVar1 = fd->fp;
  pbVar2 = (byte *)phVar1->begin;
  if (pbVar2 < phVar1->end) {
    phVar1->begin = (char *)(pbVar2 + 1);
    uVar3 = (uint)*pbVar2;
  }
  else {
    uVar3 = hgetc2(phVar1);
  }
  if (uVar3 == 0xffffffff) {
    iVar4 = -1;
  }
  else if ((uint)itf8_decode::nbytes[(int)uVar3 >> 4] < 5) {
    uVar8 = uVar3 & itf8_decode::nbits[(int)uVar3 >> 4];
    switch(itf8_decode::nbytes[(int)uVar3 >> 4]) {
    case 0:
      iVar4 = 1;
      break;
    case 1:
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar3 = (uint)*pbVar2;
      }
      else {
        uVar3 = hgetc2(phVar1);
      }
      uVar8 = uVar8 << 8 | uVar3 & 0xff;
      iVar4 = 2;
      break;
    case 2:
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar3 = (uint)*pbVar2;
      }
      else {
        uVar3 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
      }
      else {
        uVar5 = hgetc2(phVar1);
      }
      uVar8 = uVar5 & 0xff | (uVar3 & 0xff) << 8 | uVar8 << 0x10;
      iVar4 = 3;
      break;
    case 3:
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar3 = (uint)*pbVar2;
      }
      else {
        uVar3 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
      }
      else {
        uVar5 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar6 = (uint)*pbVar2;
      }
      else {
        uVar6 = hgetc2(phVar1);
      }
      uVar8 = uVar6 & 0xff | (uVar5 & 0xff | (uVar3 & 0xff) << 8 | uVar8 << 0x10) << 8;
      iVar4 = 4;
      break;
    case 4:
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar3 = (uint)*pbVar2;
      }
      else {
        uVar3 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
      }
      else {
        uVar5 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar6 = (uint)*pbVar2;
      }
      else {
        uVar6 = hgetc2(phVar1);
      }
      phVar1 = fd->fp;
      pbVar2 = (byte *)phVar1->begin;
      if (pbVar2 < phVar1->end) {
        phVar1->begin = (char *)(pbVar2 + 1);
        uVar7 = (uint)*pbVar2;
      }
      else {
        uVar7 = hgetc2(phVar1);
      }
      uVar8 = uVar7 & 0xf |
              (uVar6 & 0xff) << 4 | (uVar5 & 0xff | (uVar3 & 0xff) << 8 | uVar8 << 0x10) << 0xc;
      iVar4 = 5;
    }
    *val_p = uVar8;
  }
  else {
    iVar4 = 5;
  }
  return iVar4;
}

Assistant:

int itf8_decode(cram_fd *fd, int32_t *val_p) {
    static int nbytes[16] = {
	0,0,0,0, 0,0,0,0,                               // 0000xxxx - 0111xxxx
	1,1,1,1,                                        // 1000xxxx - 1011xxxx
	2,2,                                            // 1100xxxx - 1101xxxx
	3,                                              // 1110xxxx
	4,                                              // 1111xxxx
    };

    static int nbits[16] = {
	0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, 0x7f, // 0000xxxx - 0111xxxx
	0x3f, 0x3f, 0x3f, 0x3f,                         // 1000xxxx - 1011xxxx
	0x1f, 0x1f,                                     // 1100xxxx - 1101xxxx
	0x0f,                                           // 1110xxxx
	0x0f,                                           // 1111xxxx
    };

    int32_t val = hgetc(fd->fp);
    if (val == -1)
	return -1;

    int i = nbytes[val>>4];
    val &= nbits[val>>4];

    switch(i) {
    case 0:
	*val_p = val;
	return 1;

    case 1:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 2;

    case 2:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 3;

    case 3:
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
	return 4;

    case 4: // really 3.5 more, why make it different?
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<4) | (((unsigned char)hgetc(fd->fp)) & 0x0f);
	*val_p = val;
    }

    return 5;
}